

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_util.c
# Opt level: O1

void dec_derive_skip_mv_affine(com_core_t *core,int mrg_idx)

{
  pthread_mutex_t *ppVar1;
  com_scu_t cVar2;
  short sVar3;
  short sVar4;
  int iVar5;
  s16 asVar6 [2];
  s16 (*paasVar7) [2] [2];
  com_pic_t *pcVar8;
  bool bVar9;
  com_core_t *pcVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  byte bVar14;
  byte bVar15;
  s16 sVar16;
  int iVar17;
  s8 *psVar18;
  int *piVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  undefined4 in_register_00000034;
  uint *puVar27;
  int *piVar28;
  uint uVar29;
  long lVar30;
  int iVar31;
  int iVar32;
  com_scu_t *pcVar33;
  uint uVar34;
  uint uVar35;
  int *piVar36;
  int iVar37;
  uint uVar38;
  int *unaff_R13;
  int iVar39;
  int iVar40;
  undefined4 *puVar41;
  bool bVar42;
  s8 mrg_list_refi [2];
  s16 neb_mv [4] [2];
  int valid_model [2];
  int top_left [5];
  int neighbor [5];
  int neb_addr_lt [3];
  int valid [5];
  int neb_addr_rt [2];
  CPMV mrg_list_cp_mv [2] [4] [2];
  s8 local_20e [2];
  s16 local_20c [2];
  s16 local_208;
  s16 sStack_206;
  int local_204;
  s8 local_1fe [2];
  int local_1fc;
  undefined8 local_1f8;
  short local_1f0;
  short sStack_1ee;
  undefined4 uStack_1ec;
  undefined8 local_1e0;
  ulong local_1d8;
  com_core_t *local_1d0;
  int *local_1c8;
  uint local_1c0 [9];
  undefined4 local_19c;
  s8 (*local_190) [2];
  int local_188 [16];
  uint local_148 [4];
  undefined4 local_138;
  int local_134 [2];
  s16 local_12c [2];
  int local_128;
  ulong local_118;
  ulong local_110;
  int local_104;
  int local_100;
  uint local_fc;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  uint local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  long local_d8;
  long local_d0;
  u32 *local_c8;
  int local_c0 [2];
  ulong local_b8;
  ulong local_b0;
  com_seqh_t *local_a8;
  com_scu_t *local_a0;
  ulong local_98;
  ulong local_90;
  long local_88;
  s8 (*local_80) [2];
  int local_78;
  int aiStack_74 [17];
  
  local_1e0 = CONCAT44(in_register_00000034,mrg_idx);
  uVar38 = core->cu_scup;
  local_a8 = core->seqhdr;
  iVar25 = local_a8->log2_max_cuwh;
  iVar22 = local_a8->i_scu;
  iVar5 = core->cu_width;
  iVar40 = core->cu_height;
  local_d0 = (long)iVar5;
  uVar20 = iVar5 >> 2;
  local_d8 = (long)iVar40;
  local_190 = (core->map).map_refi;
  paasVar7 = (core->map).map_mv;
  pcVar33 = (core->map).map_scu;
  local_1d0 = core;
  local_c8 = (core->map).map_pos;
  iVar31 = uVar38 + ((iVar40 >> 2) + -1) * iVar22 + -1;
  local_188[0] = iVar31;
  uVar26 = uVar38 - iVar22;
  local_f4 = uVar20 + uVar26 + -1;
  local_188[1] = local_f4;
  local_b0 = (ulong)uVar20;
  local_f8 = uVar20 + uVar26;
  local_188[2] = uVar20 + uVar26;
  local_90 = (ulong)uVar38;
  local_fc = uVar38 - 1;
  local_188[3] = uVar38 - 1;
  local_b8 = (ulong)uVar26;
  local_100 = uVar26 - 1;
  local_188[4] = uVar26 - 1;
  lVar11 = 0;
  do {
    cVar2 = pcVar33[local_188[lVar11]];
    (&local_138)[lVar11] = (byte)cVar2 >> 5 & 3;
    asVar6 = local_12c;
    if (((byte)cVar2 >> 5 & 3) != 0) {
      local_1c0[lVar11 + 2] = local_c8[local_188[lVar11]] >> 6;
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 5);
  local_104 = mrg_idx + 1;
  iVar24 = 2;
  if (local_104 < 2) {
    iVar24 = local_104;
  }
  if ((local_134[0] != 0 && local_134[1] != 0) && (local_1c0[3] == local_1c0[4])) {
    local_134[1] = 0;
  }
  if (((local_12c != (s16  [2])0x0) && (local_138 != 0)) && (local_1c0[2] == local_1c0[5])) {
    local_12c[0] = 0;
    local_12c[1] = 0;
  }
  if (((local_128 != 0 && asVar6 != (s16  [2])0x0) && (local_1c0[6] == local_1c0[5])) ||
     ((local_134[0] != 0 && local_128 != 0 && (local_1c0[6] == local_1c0[3])))) {
    local_128 = 0;
  }
  local_f0 = iVar31;
  if (mrg_idx < 0) {
    iVar25 = 0;
  }
  else {
    local_e8 = ~(-1 << ((byte)iVar25 & 0x1f));
    uVar13 = 0;
    local_1fe = local_20e;
    iVar25 = 0;
    local_e4 = iVar22;
    local_a0 = pcVar33;
    local_ec = iVar24;
    iVar37 = iVar22;
    do {
      if ((&local_138)[uVar13] != 0) {
        if (iVar25 == mrg_idx) {
          local_98 = uVar13;
          local_88 = (long)local_188[uVar13];
          unaff_R13 = (int *)(ulong)(((byte)pcVar33[local_88] & 0x60) == 0x20 ^ 3);
          local_1fe = local_190[local_88];
          local_80 = local_190 + local_88;
          lVar11 = 0;
          do {
            if (-1 < local_190[local_88][lVar11]) {
              local_148[0] = local_c8[local_88];
              bVar14 = (byte)local_148[0] & 7;
              bVar15 = (byte)(local_148[0] >> 3) & 7;
              uVar20 = 1 << bVar15;
              local_148[0] = local_148[0] >> 6;
              uVar26 = (uint)(1 << bVar14) >> 2;
              local_148[1] = uVar26 + local_148[0] + -1;
              local_148[2] = ((uVar20 >> 2) - 1) * iVar37 + local_148[0];
              local_148[3] = local_148[2] + uVar26 + -1;
              iVar24 = (int)((long)(ulong)local_148[0] / (long)iVar37);
              lVar12 = 0;
              do {
                *(s16 (*) [2])((long)&local_1f8 + lVar12 * 4) =
                     paasVar7[(int)local_148[lVar12]][lVar11];
                lVar12 = lVar12 + 1;
              } while (lVar12 != 4);
              uVar26 = ((int)uVar38 / iVar37) * 4;
              uVar20 = uVar20 + iVar24 * 4;
              bVar42 = uVar20 != uVar26;
              bVar9 = (uVar20 & local_e8) != 0;
              if (bVar42 || bVar9) {
                uVar20 = iVar24 << 2;
              }
              else {
                local_1f8 = CONCAT44(uStack_1ec,CONCAT22(sStack_1ee,local_1f0));
              }
              bVar14 = bVar14 ^ 7;
              iVar24 = (int)(short)local_1f8;
              uVar34 = local_1f8._4_2_ - iVar24 << bVar14;
              iVar32 = (int)local_1f8._2_2_;
              iVar39 = local_1f8._6_2_ - iVar32 << bVar14;
              if ((int)unaff_R13 == 3 && (bVar42 || bVar9)) {
                local_1c8 = unaff_R13;
                bVar15 = bVar15 ^ 7;
                uVar29 = local_1f0 - iVar24 << bVar15;
                uVar35 = sStack_1ee - iVar32 << bVar15;
              }
              else {
                uVar29 = -iVar39;
                local_1c8 = (int *)0x2;
                uVar35 = uVar34;
              }
              iVar21 = ((int)uVar38 % iVar37 - (int)((long)(ulong)local_148[0] % (long)iVar37)) * 4;
              local_1fc = uVar26 - uVar20;
              local_118 = (ulong)uVar29;
              local_dc = uVar34 * iVar21 + iVar24 * 0x80;
              iVar37 = 0;
              iVar17 = 0;
              uVar20 = uVar29 * local_1fc + local_dc;
              if (uVar20 != 0) {
                uVar26 = (int)uVar20 >> 0x1f;
                iVar17 = (((int)(((uVar20 ^ uVar26) - uVar26) + 0x40) >> 7 ^ uVar26) - uVar26) * 4;
              }
              iVar32 = iVar32 * 0x80;
              local_110 = (ulong)uVar35;
              local_1d8 = CONCAT44(local_1d8._4_4_,iVar32);
              local_e0 = iVar39 * iVar21 + iVar32;
              uVar20 = uVar35 * local_1fc + local_e0;
              if (uVar20 != 0) {
                uVar26 = (int)uVar20 >> 0x1f;
                iVar37 = (((int)(((uVar20 ^ uVar26) - uVar26) + 0x40) >> 7 ^ uVar26) - uVar26) * 4;
              }
              if (0x1fffe < iVar17) {
                iVar17 = 0x1ffff;
              }
              if (iVar17 < -0x1ffff) {
                iVar17 = -0x20000;
              }
              if (0x1fffe < iVar37) {
                iVar37 = 0x1ffff;
              }
              if (iVar37 < -0x1ffff) {
                iVar37 = -0x20000;
              }
              (&local_78)[lVar11 * 8] = iVar17;
              aiStack_74[lVar11 * 8] = iVar37;
              iVar17 = 0;
              iVar37 = 0;
              uVar20 = uVar34 * (iVar21 + iVar5) + iVar24 * 0x80 + uVar29 * local_1fc;
              if (uVar20 != 0) {
                uVar26 = (int)uVar20 >> 0x1f;
                iVar37 = (((int)(((uVar20 ^ uVar26) - uVar26) + 0x40) >> 7 ^ uVar26) - uVar26) * 4;
              }
              uVar20 = iVar39 * (iVar21 + iVar5) + iVar32 + uVar35 * local_1fc;
              if (uVar20 != 0) {
                uVar26 = (int)uVar20 >> 0x1f;
                iVar17 = (((int)(((uVar20 ^ uVar26) - uVar26) + 0x40) >> 7 ^ uVar26) - uVar26) * 4;
              }
              if (0x1fffe < iVar37) {
                iVar37 = 0x1ffff;
              }
              if (iVar37 < -0x1ffff) {
                iVar37 = -0x20000;
              }
              aiStack_74[lVar11 * 8U + 1] = iVar37;
              if (0x1fffe < iVar17) {
                iVar17 = 0x1ffff;
              }
              if (iVar17 < -0x1ffff) {
                iVar17 = -0x20000;
              }
              aiStack_74[lVar11 * 8U + 2] = iVar17;
              unaff_R13 = local_1c8;
              iVar37 = local_e4;
              if ((int)local_1c8 == 3) {
                iVar37 = 0;
                iVar24 = 0;
                uVar20 = uVar29 * (local_1fc + iVar40) + local_dc;
                if (uVar20 != 0) {
                  uVar26 = (int)uVar20 >> 0x1f;
                  iVar24 = (((int)(((uVar20 ^ uVar26) - uVar26) + 0x40) >> 7 ^ uVar26) - uVar26) * 4
                  ;
                }
                uVar20 = uVar35 * (local_1fc + iVar40) + local_e0;
                if (uVar20 != 0) {
                  uVar26 = (int)uVar20 >> 0x1f;
                  iVar37 = (((int)(((uVar20 ^ uVar26) - uVar26) + 0x40) >> 7 ^ uVar26) - uVar26) * 4
                  ;
                }
                if (0x1fffe < iVar24) {
                  iVar24 = 0x1ffff;
                }
                if (iVar24 < -0x1ffff) {
                  iVar24 = -0x20000;
                }
                aiStack_74[lVar11 * 8U + 3] = iVar24;
                if (0x1fffe < iVar37) {
                  iVar37 = 0x1ffff;
                }
                if (iVar37 < -0x1ffff) {
                  iVar37 = -0x20000;
                }
                aiStack_74[lVar11 * 8U + 4] = iVar37;
                iVar37 = iVar22;
              }
            }
            bVar42 = lVar11 == 0;
            uVar13 = local_98;
            lVar11 = lVar11 + 1;
            pcVar33 = local_a0;
            iVar24 = local_ec;
            local_204 = iVar25;
          } while (bVar42);
        }
        iVar25 = iVar25 + 1;
      }
    } while ((uVar13 < 4) && (uVar13 = uVar13 + 1, iVar25 < iVar24));
    local_20e[0] = local_1fe[0];
    local_20e[1] = local_1fe[1];
    iVar22 = iVar37;
  }
  uVar38 = (uint)unaff_R13;
  if (mrg_idx < iVar25) {
LAB_00109d75:
    pcVar10 = local_1d0;
    if (iVar25 <= (int)local_1e0) {
      local_20e[0] = '\0';
      local_20e[1] = -1;
      _local_78 = 0;
      aiStack_74[1] = 0;
      aiStack_74[2] = 0;
      aiStack_74[3] = 0;
      aiStack_74[4] = 0;
      aiStack_74[5] = 0;
      aiStack_74[6] = 0;
      aiStack_74[7] = 0;
      aiStack_74[8] = 0;
      aiStack_74[9] = 0;
      aiStack_74[10] = 0;
      aiStack_74[0xb] = 0;
      aiStack_74[0xc] = 0;
      aiStack_74[0xd] = 0;
      aiStack_74[0xe] = 0;
      uVar38 = 2;
    }
    local_1d0->affine_flag = (char)uVar38 + 0xff;
    lVar11 = 0;
    lVar12 = 0;
    do {
      if (local_20e[lVar12] < '\0') {
        pcVar10->refi[lVar12] = -1;
      }
      else {
        pcVar10->refi[lVar12] = local_20e[lVar12];
        if (0 < (int)uVar38) {
          memcpy((void *)((long)pcVar10->affine_mv[0][0] + lVar11),
                 (void *)((long)&local_78 + lVar11),(ulong)uVar38 << 3);
        }
      }
      lVar12 = lVar12 + 1;
      lVar11 = lVar11 + 0x20;
    } while (lVar12 == 1);
    return;
  }
  puVar27 = local_1c0 + 2;
  lVar11 = 0;
  do {
    lVar12 = 0;
    do {
      *(undefined4 *)((long)puVar27 + lVar12) = 0xffffffff;
      lVar12 = lVar12 + 0x10;
    } while (lVar12 == 0x10);
    *(undefined4 *)((long)&local_1f8 + lVar11 * 4) = 0;
    lVar11 = lVar11 + 1;
    puVar27 = puVar27 + 1;
  } while (lVar11 != 4);
  local_1fc = 5;
  if (local_104 < 5) {
    local_1fc = local_104;
  }
  local_148[0] = local_fc;
  local_148[1] = (int)local_b8;
  local_148[2] = local_100;
  lVar11 = 0;
  while (uVar20 = local_148[lVar11], ((byte)pcVar33[(int)uVar20] & 4) == 0) {
    lVar11 = lVar11 + 1;
    if (lVar11 == 3) goto LAB_00109418;
  }
  psVar18 = local_190[(int)uVar20];
  lVar11 = 0;
  do {
    local_1c0[lVar11 + 2] = (int)*psVar18;
    (&local_138)[lVar11] = *(undefined4 *)((long)paasVar7[(int)uVar20][0] + lVar11);
    lVar11 = lVar11 + 4;
    psVar18 = psVar18 + 1;
  } while (lVar11 == 4);
  local_1f8 = CONCAT44(local_1f8._4_4_,1);
LAB_00109418:
  local_c0[0] = local_f4;
  local_c0[1] = local_f8;
  lVar11 = 0;
  while (iVar5 = local_c0[lVar11], ((byte)pcVar33[iVar5] & 4) == 0) {
    lVar11 = lVar11 + 1;
    if (lVar11 != 1) goto LAB_00109488;
  }
  psVar18 = local_190[iVar5];
  lVar11 = 0;
  do {
    local_1c0[lVar11 + 3] = (int)*psVar18;
    local_134[lVar11] = *(int *)((long)paasVar7[iVar5][0] + lVar11);
    lVar11 = lVar11 + 4;
    psVar18 = psVar18 + 1;
  } while (lVar11 == 4);
  local_1f8 = CONCAT44(1,(undefined4)local_1f8);
LAB_00109488:
  if (((byte)pcVar33[iVar31] & 4) != 0) {
    psVar18 = local_190[iVar31];
    lVar11 = 0;
    do {
      local_1c0[lVar11 + 4] = (int)*psVar18;
      local_134[lVar11 + 1] = *(int *)((long)paasVar7[iVar31][0] + lVar11);
      lVar11 = lVar11 + 4;
      psVar18 = psVar18 + 1;
    } while (lVar11 == 4);
    local_1f0 = 1;
    sStack_1ee = 0;
  }
  uVar20 = (iVar31 + (int)local_b0) % iVar22 & 0xfffffffc;
  uVar26 = (iVar31 + (int)local_b0) / iVar22 & 0xfffffffc;
  iVar5 = uVar26 + 2;
  iVar40 = (int)(uVar26 + local_a8->pic_height_in_scu) >> 1;
  if (iVar5 < local_a8->pic_height_in_scu) {
    iVar40 = iVar5;
  }
  iVar5 = uVar20 + 2;
  iVar31 = (int)(uVar20 + local_a8->pic_width_in_scu) >> 1;
  if (iVar5 < local_a8->pic_width_in_scu) {
    iVar31 = iVar5;
  }
  iVar31 = iVar22 * iVar40 + iVar31;
  local_204 = iVar25;
  if (core->pichdr->slice_type == '\x03') {
    pcVar8 = core->refp[0][1].pic;
    iVar25 = iVar40 * 4;
    if (SBORROW4(pcVar8->finished_line,iVar25) != pcVar8->finished_line + iVar40 * -4 < 0) {
      ppVar1 = &pcVar8->mutex;
      pthread_mutex_lock((pthread_mutex_t *)ppVar1);
      if (SBORROW4(pcVar8->finished_line,iVar25) != pcVar8->finished_line + iVar40 * -4 < 0) {
        do {
          pthread_cond_wait((pthread_cond_t *)&pcVar8->cond,(pthread_mutex_t *)ppVar1);
        } while (SBORROW4(pcVar8->finished_line,iVar25) != pcVar8->finished_line + iVar40 * -4 < 0);
      }
      pthread_mutex_unlock((pthread_mutex_t *)ppVar1);
    }
    lVar11 = (long)local_1d0->refp[0][1].map_refi[iVar31][0];
    if (lVar11 < 0) goto LAB_0010982b;
    paasVar7 = local_1d0->refp[0][1].map_mv;
    sVar3 = (local_1d0->refp[0][1].pic)->list_dist[lVar11];
    iVar25 = (int)sVar3;
    sVar4 = local_1d0->refp[0][0].dist;
    local_20c[0] = 0;
    local_20c[1] = 0;
    asVar6 = paasVar7[iVar31][0];
    if (asVar6 != (s16  [2])0x0) {
      if ((sVar3 == sVar4) && ((int)(0x4000 % (long)iVar25) == 0)) {
        local_20c[0] = asVar6[0];
        local_20c[1] = asVar6[1];
      }
      else {
        lVar12 = (long)paasVar7[iVar31][0][0];
        lVar11 = (long)((int)sVar4 * (int)(0x2000 / (long)iVar25) * 2);
        if (lVar12 != 0) {
          uVar23 = lVar12 * lVar11;
          uVar13 = (long)uVar23 >> 0x3f;
          lVar12 = ((long)(((uVar23 ^ uVar13) - uVar13) + 0x2000) >> 0xe ^ uVar13) - uVar13;
          if (0x7ffe < lVar12) {
            lVar12 = 0x7fff;
          }
          local_20c[0] = 0x8000;
          if (-0x8000 < lVar12) {
            local_20c[0] = (s16)lVar12;
          }
          local_20c[1] = 0;
        }
        lVar12 = (long)paasVar7[iVar31][0][1];
        if (lVar12 != 0) {
          uVar23 = lVar12 * lVar11;
          uVar13 = (long)uVar23 >> 0x3f;
          lVar11 = ((long)(((uVar23 ^ uVar13) - uVar13) + 0x2000) >> 0xe ^ uVar13) - uVar13;
          if (0x7ffe < lVar11) {
            lVar11 = 0x7fff;
          }
          lVar12 = -0x8000;
          if (-0x8000 < lVar11) {
            lVar12 = lVar11;
          }
          local_20c[1] = (s16)lVar12;
        }
      }
    }
    sVar4 = local_1d0->refp[0][1].dist;
    local_208 = 0;
    sStack_206 = 0;
    if (asVar6 != (s16  [2])0x0) {
      if ((sVar3 == sVar4) && ((int)(0x4000 % (long)iVar25) == 0)) {
        local_208 = asVar6[0];
        sStack_206 = asVar6[1];
      }
      else {
        lVar12 = (long)paasVar7[iVar31][0][0];
        lVar11 = (long)((int)sVar4 * (int)(0x2000 / (long)iVar25) * 2);
        if (lVar12 != 0) {
          uVar23 = lVar12 * lVar11;
          uVar13 = (long)uVar23 >> 0x3f;
          lVar12 = ((long)(((uVar23 ^ uVar13) - uVar13) + 0x2000) >> 0xe ^ uVar13) - uVar13;
          if (0x7ffe < lVar12) {
            lVar12 = 0x7fff;
          }
          lVar30 = -0x8000;
          if (-0x8000 < lVar12) {
            lVar30 = lVar12;
          }
          sStack_206 = 0;
          local_208 = (ushort)lVar30;
        }
        lVar12 = (long)paasVar7[iVar31][0][1];
        if (lVar12 != 0) {
          uVar23 = lVar12 * lVar11;
          uVar13 = (long)uVar23 >> 0x3f;
          lVar11 = ((long)(((uVar23 ^ uVar13) - uVar13) + 0x2000) >> 0xe ^ uVar13) - uVar13;
          if (0x7ffe < lVar11) {
            lVar11 = 0x7fff;
          }
          sVar16 = -0x8000;
          if (-0x8000 < lVar11) {
            sVar16 = (s16)lVar11;
          }
          sStack_206 = sVar16;
        }
      }
    }
    lVar11 = 0;
    do {
      local_1c0[lVar11 + 5] = 0;
      local_134[lVar11 + 2] = *(int *)((long)local_20c + lVar11);
      lVar11 = lVar11 + 4;
    } while (lVar11 == 4);
LAB_0010996f:
    uStack_1ec = 1;
  }
  else {
    pcVar8 = core->refp[0][0].pic;
    iVar40 = iVar40 * 4;
    if (pcVar8->finished_line < iVar40) {
      ppVar1 = &pcVar8->mutex;
      pthread_mutex_lock((pthread_mutex_t *)ppVar1);
      if (pcVar8->finished_line < iVar40) {
        do {
          pthread_cond_wait((pthread_cond_t *)&pcVar8->cond,(pthread_mutex_t *)ppVar1);
        } while (pcVar8->finished_line < iVar40);
      }
      pthread_mutex_unlock((pthread_mutex_t *)ppVar1);
    }
    lVar11 = (long)local_1d0->refp[0][0].map_refi[iVar31][0];
    if (-1 < lVar11) {
      sVar3 = local_1d0->refp[0][0].dist;
      paasVar7 = local_1d0->refp[0][0].map_mv;
      sVar4 = (local_1d0->refp[0][0].pic)->list_dist[lVar11];
      local_20c[0] = 0;
      local_20c[1] = 0;
      asVar6 = paasVar7[iVar31][0];
      if (asVar6 != (s16  [2])0x0) {
        if ((sVar4 == sVar3) && ((int)(0x4000 % (long)(int)sVar4) == 0)) {
          local_20c[0] = asVar6[0];
          local_20c[1] = asVar6[1];
        }
        else {
          lVar12 = (long)paasVar7[iVar31][0][0];
          lVar11 = (long)((int)sVar3 * (int)(0x2000 / (long)(int)sVar4) * 2);
          if (lVar12 != 0) {
            uVar23 = lVar12 * lVar11;
            uVar13 = (long)uVar23 >> 0x3f;
            lVar12 = ((long)(((uVar23 ^ uVar13) - uVar13) + 0x2000) >> 0xe ^ uVar13) - uVar13;
            if (0x7ffe < lVar12) {
              lVar12 = 0x7fff;
            }
            lVar30 = -0x8000;
            if (-0x8000 < lVar12) {
              lVar30 = lVar12;
            }
            local_20c[1] = 0;
            local_20c[0] = (ushort)lVar30;
          }
          lVar12 = (long)paasVar7[iVar31][0][1];
          if (lVar12 != 0) {
            uVar23 = lVar12 * lVar11;
            uVar13 = (long)uVar23 >> 0x3f;
            lVar11 = ((long)(((uVar23 ^ uVar13) - uVar13) + 0x2000) >> 0xe ^ uVar13) - uVar13;
            if (0x7ffe < lVar11) {
              lVar11 = 0x7fff;
            }
            lVar12 = -0x8000;
            if (-0x8000 < lVar11) {
              lVar12 = lVar11;
            }
            local_20c[1] = (s16)lVar12;
          }
        }
      }
      local_1c0[5] = 0;
      local_12c[0] = local_20c[0];
      local_12c[1] = local_20c[1];
      local_19c = 0xffffffff;
      goto LAB_0010996f;
    }
LAB_0010982b:
    uStack_1ec = 0;
  }
  iVar25 = local_204;
  if (local_1fc <= local_204) goto LAB_00109d75;
  puVar41 = &DAT_0015e980;
  uVar13 = 0;
  do {
    local_1c8 = &DAT_0015e980 + uVar13 * 4;
    piVar36 = (int *)(ulong)(uint)(&get_affine_merge_candidate_cp_num)[uVar13];
    local_1c0[0] = 0;
    local_1c0[1] = 0;
    if (piVar36 == (int *)0x3) {
      iVar22 = *local_1c8;
      if (((*(int *)((long)&local_1f8 + (long)iVar22 * 4) != 0) &&
          (iVar5 = (&DAT_0015e984)[uVar13 * 4], *(int *)((long)&local_1f8 + (long)iVar5 * 4) != 0))
         && (iVar40 = (&DAT_0015e988)[uVar13 * 4],
            *(int *)((long)&local_1f8 + (long)iVar40 * 4) != 0)) {
        lVar11 = 0;
        do {
          uVar38 = local_1c0[(long)iVar22 + lVar11 + 2];
          if (((-1 < (int)uVar38) && (-1 < (int)local_1c0[(long)iVar5 + lVar11 + 2])) &&
             ((uVar38 == local_1c0[(long)iVar40 + lVar11 + 2] &&
              ((uVar38 == local_1c0[(long)iVar5 + lVar11 + 2] &&
               (-1 < (int)local_1c0[(long)iVar40 + lVar11 + 2])))))) {
            *(undefined4 *)((long)local_1c0 + lVar11) = 1;
          }
          lVar11 = lVar11 + 4;
        } while (lVar11 == 4);
        goto LAB_00109aad;
      }
    }
    else {
      if ((&get_affine_merge_candidate_cp_num)[uVar13] == 2) {
        iVar22 = *local_1c8;
        if ((*(int *)((long)&local_1f8 + (long)iVar22 * 4) == 0) ||
           (iVar5 = (&DAT_0015e984)[uVar13 * 4], *(int *)((long)&local_1f8 + (long)iVar5 * 4) == 0))
        goto LAB_00109d5e;
        lVar11 = 0;
        do {
          if ((-1 < (int)local_1c0[(long)iVar22 + lVar11 + 2]) &&
             (local_1c0[(long)iVar22 + lVar11 + 2] == local_1c0[(long)iVar5 + lVar11 + 2])) {
            *(undefined4 *)((long)local_1c0 + lVar11) = 1;
          }
          lVar11 = lVar11 + 4;
        } while (lVar11 == 4);
      }
LAB_00109aad:
      if (local_1c0[1] != 0 || local_1c0[0] != 0) {
        unaff_R13 = piVar36;
        if (iVar25 == (int)local_1e0) {
          local_118 = uVar13;
          local_1d8 = (ulong)((int)uVar13 - 1);
          piVar28 = local_188 + 1;
          lVar11 = (long)aiStack_74;
          lVar12 = 0;
          local_204 = iVar25;
          do {
            if (local_1c0[lVar12] == 0) {
              local_20e[lVar12] = -1;
            }
            else {
              piVar19 = (int *)0x0;
              do {
                lVar30 = (long)(int)puVar41[(long)piVar19];
                local_188[lVar12 * 8 + lVar30 * 2] =
                     (int)*(short *)(&local_138 + lVar12 * 4 + lVar30);
                local_188[lVar12 * 8U + lVar30 * 2U + 1U] =
                     (int)*(short *)((long)&local_138 + lVar30 * 4 + lVar12 * 0x10 + 2);
                piVar19 = (int *)((long)piVar19 + 1);
              } while (piVar36 != piVar19);
              if ((uint)local_1d8 < 5) {
                (*(code *)(&DAT_0015e910 + *(int *)(&DAT_0015e910 + local_1d8 * 4)))();
                return;
              }
              local_20e[lVar12] = (s8)local_1c0[lVar12 * 4 + (long)*local_1c8 + 2];
              piVar19 = (int *)0x0;
              do {
                iVar25 = piVar28[(long)piVar19 * 2];
                iVar22 = piVar28[(long)piVar19 * 2 + -1] << 2;
                piVar28[(long)piVar19 * 2 + -1] = iVar22;
                iVar25 = iVar25 << 2;
                if (0x1fffe < iVar22) {
                  iVar22 = 0x1ffff;
                }
                if (iVar22 < -0x1ffff) {
                  iVar22 = -0x20000;
                }
                piVar28[(long)piVar19 * 2] = iVar25;
                if (0x1fffe < iVar25) {
                  iVar25 = 0x1ffff;
                }
                if (iVar25 < -0x1ffff) {
                  iVar25 = -0x20000;
                }
                *(int *)(lVar11 + ((long)piVar19 * 2 + -1) * 4) = iVar22;
                *(int *)(lVar11 + (long)piVar19 * 8U) = iVar25;
                piVar19 = (int *)((long)piVar19 + 1);
              } while (piVar36 != piVar19);
            }
            lVar11 = lVar11 + 0x20;
            piVar28 = piVar28 + 8;
            bVar42 = lVar12 == 0;
            lVar12 = lVar12 + 1;
          } while (bVar42);
          iVar25 = local_204 + 1;
          uVar13 = local_118;
        }
        else {
          iVar25 = iVar25 + 1;
        }
      }
    }
LAB_00109d5e:
    uVar38 = (uint)unaff_R13;
    if (4 < uVar13) goto LAB_00109d75;
    uVar13 = uVar13 + 1;
    puVar41 = puVar41 + 4;
    if (local_1fc <= iVar25) goto LAB_00109d75;
  } while( true );
}

Assistant:

void dec_derive_skip_mv_affine(com_core_t * core, int mrg_idx)
{
    s8  mrg_list_refi  [REFP_NUM];
    int mrg_list_cp_num;
    CPMV mrg_list_cp_mv[REFP_NUM][VER_NUM][MV_D];
    int cp_idx, lidx;

    get_affine_merge_candidate(core, mrg_list_refi, mrg_list_cp_mv, &mrg_list_cp_num, mrg_idx);
    
    core->affine_flag = mrg_list_cp_num - 1;

    for (lidx = 0; lidx < REFP_NUM; lidx++) {
        if (REFI_IS_VALID(mrg_list_refi[lidx])) {
            core->refi[lidx] = mrg_list_refi[lidx];
            for (cp_idx = 0; cp_idx < mrg_list_cp_num; cp_idx++) {
                CP64(core->affine_mv[lidx][cp_idx], mrg_list_cp_mv[lidx][cp_idx]);
            }
        } else {
            core->refi[lidx] = REFI_INVALID;
        }
    }
}